

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanodetplus_pnnx.cpp
# Opt level: O1

void generate_proposals(Mat *pred,int stride,Mat *in_pad,float prob_threshold,
                       vector<Object,_std::allocator<Object>_> *objects)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  int *piVar5;
  Layer *pLVar6;
  void *pvVar7;
  float *pfVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  undefined4 *puVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  float pred_ltrb [4];
  Option opt;
  long local_130;
  ParamDict local_118;
  ulong local_108;
  long local_100;
  Mat local_f8;
  long local_a8;
  ulong local_a0;
  ulong local_98;
  Mat *local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [12];
  float fStack_6c;
  int local_68;
  float local_64;
  bool local_51;
  
  iVar1 = pred->c;
  local_a8 = (long)pred->h;
  iVar9 = iVar1 + -0x4d;
  if (-1 < iVar1 + -0x50) {
    iVar9 = iVar1 + -0x50;
  }
  if (0 < local_a8) {
    local_108 = (ulong)(uint)pred->w;
    uVar10 = iVar9 >> 2;
    local_98 = (ulong)uVar10;
    local_a0 = (ulong)(uVar10 * 4);
    if ((int)(uVar10 * 4) < 2) {
      local_a0 = 1;
    }
    uVar4 = 1;
    if (1 < (int)uVar10) {
      uVar4 = uVar10;
    }
    local_130 = 0;
    local_90 = in_pad;
    do {
      if (0 < (int)local_108) {
        local_88 = ZEXT416((uint)(float)((int)local_130 * stride));
        local_100 = 0;
        uVar15 = 0;
        do {
          pfVar8 = (float *)(local_130 * pred->elemsize * (long)pred->w + local_100 +
                            (long)pred->data);
          uVar14 = 0xffffffff;
          uVar11 = 0;
          fVar16 = -3.4028235e+38;
          do {
            if (fVar16 < *pfVar8) {
              uVar14 = uVar11 & 0xffffffff;
              fVar16 = *pfVar8;
            }
            uVar11 = uVar11 + 1;
            pfVar8 = (float *)((long)pfVar8 + pred->elemsize * pred->cstep);
          } while (uVar11 != 0x50);
          fVar16 = expf(-fVar16);
          fVar16 = 1.0 / (fVar16 + 1.0);
          if (0.4 <= fVar16) {
            local_f8.cstep = 0;
            local_f8.data = (void *)0x0;
            local_f8.refcount._0_4_ = 0;
            local_f8.refcount._4_4_ = 0;
            local_f8.elemsize._0_4_ = 0;
            local_f8.elemsize._4_4_ = 0;
            local_f8.elempack = 0;
            local_f8.h = 0;
            local_f8.d = 0;
            local_f8.c = 0;
            local_f8.allocator = (Allocator *)0x0;
            local_f8.dims = 0;
            local_f8.w = 0;
            ncnn::Mat::create(&local_f8,(int)local_98,4,4,(Allocator *)0x0);
            if (0x53 < iVar1) {
              sVar2 = pred->elemsize;
              sVar3 = pred->cstep;
              puVar12 = (undefined4 *)
                        ((sVar3 * 0x50 + pred->w * local_130) * sVar2 + local_100 + (long)pred->data
                        );
              uVar11 = 0;
              do {
                *(undefined4 *)((long)local_f8.data + uVar11 * 4) = *puVar12;
                uVar11 = uVar11 + 1;
                puVar12 = (undefined4 *)((long)puVar12 + sVar3 * sVar2);
              } while (local_a0 != uVar11);
            }
            pLVar6 = ncnn::create_layer("Softmax");
            ncnn::ParamDict::ParamDict(&local_118);
            ncnn::ParamDict::set(&local_118,0,1);
            ncnn::ParamDict::set(&local_118,1,1);
            (*pLVar6->_vptr_Layer[2])(pLVar6,&local_118);
            ncnn::Option::Option((Option *)local_78);
            local_78._4_4_ = 1.4013e-45;
            local_51 = false;
            (*pLVar6->_vptr_Layer[4])(pLVar6,(Option *)local_78);
            (*pLVar6->_vptr_Layer[9])(pLVar6,&local_f8,(Option *)local_78);
            (*pLVar6->_vptr_Layer[5])(pLVar6);
            (*pLVar6->_vptr_Layer[1])(pLVar6);
            ncnn::ParamDict::~ParamDict(&local_118);
            lVar13 = 0;
            pvVar7 = local_f8.data;
            do {
              fVar17 = 0.0;
              if (0x53 < iVar1) {
                uVar11 = 0;
                do {
                  fVar17 = fVar17 + (float)(int)uVar11 * *(float *)((long)pvVar7 + uVar11 * 4);
                  uVar11 = uVar11 + 1;
                } while (uVar4 != uVar11);
              }
              *(float *)((long)&local_118._vptr_ParamDict + lVar13 * 4) = fVar17 * (float)stride;
              lVar13 = lVar13 + 1;
              pvVar7 = (void *)((long)pvVar7 +
                               (long)local_f8.w *
                               CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize));
            } while (lVar13 != 4);
            fVar17 = (float)((int)uVar15 * stride);
            local_78._0_4_ = fVar17 - SUB84(local_118._vptr_ParamDict,0);
            local_78._4_4_ =
                 (float)local_88._0_4_ - (float)((ulong)local_118._vptr_ParamDict >> 0x20);
            local_78._8_4_ = (SUB84(local_118.d,0) + fVar17) - (float)local_78._0_4_;
            fStack_6c = ((float)((ulong)local_118.d >> 0x20) + (float)local_88._0_4_) -
                        (float)local_78._4_4_;
            local_68 = (int)uVar14;
            local_64 = fVar16;
            std::vector<Object,_std::allocator<Object>_>::push_back
                      ((vector<Object,_std::allocator<Object>_> *)local_90,(value_type *)local_78);
            piVar5 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
            if (piVar5 != (int *)0x0) {
              LOCK();
              *piVar5 = *piVar5 + -1;
              UNLOCK();
              if (*piVar5 == 0) {
                if (local_f8.allocator == (Allocator *)0x0) {
                  if (local_f8.data != (void *)0x0) {
                    free(local_f8.data);
                  }
                }
                else {
                  (*(local_f8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_f8.cstep = 0;
            local_f8.data = (void *)0x0;
            local_f8.refcount._0_4_ = 0;
            local_f8.refcount._4_4_ = 0;
            local_f8.elemsize._0_4_ = 0;
            local_f8.elemsize._4_4_ = 0;
            local_f8.elempack = 0;
            local_f8.dims = 0;
            local_f8.w = 0;
            local_f8.h = 0;
            local_f8.d = 0;
            local_f8.c = 0;
          }
          uVar15 = uVar15 + 1;
          local_100 = local_100 + 4;
        } while (uVar15 != local_108);
      }
      local_130 = local_130 + 1;
    } while (local_130 != local_a8);
  }
  return;
}

Assistant:

static void generate_proposals(const ncnn::Mat& pred, int stride, const ncnn::Mat& in_pad, float prob_threshold, std::vector<Object>& objects)
{
    const int num_grid = pred.h;

    int num_grid_x = pred.w;
    int num_grid_y = pred.h;

    const int num_class = 80; // number of classes. 80 for COCO
    const int reg_max_1 = (pred.c - num_class) / 4;

    for (int i = 0; i < num_grid_y; i++)
    {
        for (int j = 0; j < num_grid_x; j++)
        {
            // find label with max score
            int label = -1;
            float score = -FLT_MAX;
            for (int k = 0; k < num_class; k++)
            {
                float s = pred.channel(k).row(i)[j];
                if (s > score)
                {
                    label = k;
                    score = s;
                }
            }

            score = sigmoid(score);

            if (score >= prob_threshold)
            {
                ncnn::Mat bbox_pred(reg_max_1, 4);
                for (int k = 0; k < reg_max_1 * 4; k++)
                {
                    bbox_pred[k] = pred.channel(num_class + k).row(i)[j];
                }
                {
                    ncnn::Layer* softmax = ncnn::create_layer("Softmax");

                    ncnn::ParamDict pd;
                    pd.set(0, 1); // axis
                    pd.set(1, 1);
                    softmax->load_param(pd);

                    ncnn::Option opt;
                    opt.num_threads = 1;
                    opt.use_packing_layout = false;

                    softmax->create_pipeline(opt);

                    softmax->forward_inplace(bbox_pred, opt);

                    softmax->destroy_pipeline(opt);

                    delete softmax;
                }

                float pred_ltrb[4];
                for (int k = 0; k < 4; k++)
                {
                    float dis = 0.f;
                    const float* dis_after_sm = bbox_pred.row(k);
                    for (int l = 0; l < reg_max_1; l++)
                    {
                        dis += l * dis_after_sm[l];
                    }

                    pred_ltrb[k] = dis * stride;
                }

                float pb_cx = j * stride;
                float pb_cy = i * stride;

                float x0 = pb_cx - pred_ltrb[0];
                float y0 = pb_cy - pred_ltrb[1];
                float x1 = pb_cx + pred_ltrb[2];
                float y1 = pb_cy + pred_ltrb[3];

                Object obj;
                obj.rect.x = x0;
                obj.rect.y = y0;
                obj.rect.width = x1 - x0;
                obj.rect.height = y1 - y0;
                obj.label = label;
                obj.prob = score;

                objects.push_back(obj);
            }
        }
    }
}